

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O2

WirehairResult __thiscall wirehair::Codec::ResumeSolveMatrix(Codec *this,uint id,void *data)

{
  ulong *puVar1;
  uint8_t uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  PeelRow *pPVar8;
  PeelColumn *pPVar9;
  uint64_t *puVar10;
  uint16_t *puVar11;
  uint64_t *puVar12;
  uint8_t *puVar13;
  byte y;
  bool bVar14;
  uint ge_column_j;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ushort uVar18;
  ulong uVar19;
  ushort uVar20;
  uint uVar21;
  uint16_t uVar22;
  uint uVar23;
  uint i;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  uint8_t *puVar28;
  uint uVar29;
  RowMixIterator mix;
  short asStack_36 [3];
  ulong uVar24;
  
  if (data == (void *)0x0) {
    return Wirehair_InvalidInput;
  }
  uVar20 = this->_row_count;
  uVar18 = this->_block_count;
  uVar15 = (uint)uVar20;
  if ((uint)uVar20 < (uint)this->_extra_count + (uint)uVar18) {
    uVar19 = (ulong)this->_pivot_count;
    this->_pivot_count = this->_pivot_count + 1;
    this->_row_count = uVar20 + 1;
    uVar23 = (uVar15 - uVar18) + (uint)this->_dense_count + (uint)this->_defer_count;
    uVar24 = (ulong)uVar23;
    this->_ge_row_map[uVar24] = uVar20;
    this->_pivots[uVar19] = (uint16_t)uVar23;
    uVar18 = this->_block_count;
  }
  else {
    uVar20 = this->_dense_count + this->_defer_count;
    for (uVar19 = (ulong)this->_next_pivot; uVar19 < this->_pivot_count; uVar19 = uVar19 + 1) {
      uVar3 = this->_pivots[uVar19];
      if ((uVar20 <= uVar3) && ((uint)uVar3 < (uint)uVar20 + (uint)this->_extra_count)) {
        uVar19 = uVar19 & 0xffff;
        goto LAB_00105bf2;
      }
    }
    uVar19 = 0;
LAB_00105bf2:
    if ((int)uVar19 == 0) {
      return Wirehair_ExtraInsufficient;
    }
    uVar24 = (ulong)this->_pivots[uVar19];
    uVar15 = (uint)this->_ge_row_map[uVar24];
  }
  pPVar8 = this->_peel_rows;
  pPVar8[uVar15].RecoveryId = id;
  puVar28 = this->_input_blocks + uVar15 * this->_block_bytes;
  if (uVar18 - 1 == id) {
    memcpy(puVar28,data,(ulong)this->_output_final_bytes);
    memset(puVar28 + this->_output_final_bytes,0,
           (ulong)(this->_block_bytes - this->_output_final_bytes));
  }
  else {
    memcpy(puVar28,data,(ulong)this->_block_bytes);
  }
  puVar12 = this->_ge_matrix + this->_ge_pitch * (int)uVar24;
  memset(puVar12,0,(ulong)this->_ge_pitch << 3);
  PeelRowParameters::Initialize
            (&pPVar8[uVar15].Params,id,this->_p_seed,this->_block_count,this->_mix_count);
  uVar20 = this->_mix_count;
  uVar22 = pPVar8[uVar15].Params.PeelCount;
  uVar17 = (ulong)pPVar8[uVar15].Params.PeelFirst;
  uVar18 = pPVar8[uVar15].Params.PeelAdd;
  uVar3 = this->_block_count;
  uVar4 = this->_block_next_prime;
  uVar5 = this->_mix_next_prime;
  uVar6 = pPVar8[uVar15].Params.MixFirst;
  uVar7 = pPVar8[uVar15].Params.MixAdd;
  uVar23 = (uint)uVar7;
  uVar15 = (uint)uVar6;
  for (lVar25 = 1; lVar25 != 3; lVar25 = lVar25 + 1) {
    uVar15 = ((uVar15 & 0xffff) + (uint)uVar7) % (uint)uVar5;
    if (uVar20 <= uVar15) {
      uVar15 = uVar5 - uVar15;
      uVar21 = uVar15 & 0xffff;
      if (uVar7 < (ushort)uVar15) {
        uVar15 = (uVar23 * 0x10000 - uVar21) % uVar23;
      }
      else {
        uVar15 = uVar23 - uVar21;
      }
    }
    asStack_36[lVar25] = (short)uVar15;
  }
  uVar5 = this->_defer_count;
  uVar16 = (ulong)((uint)uVar6 + (uint)uVar5);
  puVar12[(uVar16 & 0xffff) >> 6] = puVar12[(uVar16 & 0xffff) >> 6] ^ 1L << (uVar16 & 0x3f);
  puVar12[(ushort)(asStack_36[1] + uVar5) >> 6] =
       puVar12[(ushort)(asStack_36[1] + uVar5) >> 6] ^
       1L << ((ulong)(ushort)(asStack_36[1] + uVar5) & 0x3f);
  puVar12[(ushort)(asStack_36[2] + uVar5) >> 6] =
       puVar12[(ushort)(asStack_36[2] + uVar5) >> 6] ^
       1L << ((ulong)(ushort)(asStack_36[2] + uVar5) & 0x3f);
  pPVar9 = this->_peel_cols;
  puVar10 = this->_compress_matrix;
  uVar15 = this->_ge_pitch;
  while( true ) {
    uVar17 = uVar17 & 0xffff;
    uVar6 = pPVar9[uVar17].field_1.Weight2Refs;
    if (pPVar9[uVar17].Mark == '\x01') {
      for (uVar16 = 0; uVar15 != uVar16; uVar16 = uVar16 + 1) {
        puVar12[uVar16] = puVar12[uVar16] ^ puVar10[uVar6 * uVar15 + uVar16];
      }
    }
    else {
      puVar12[uVar6 >> 6] = puVar12[uVar6 >> 6] ^ 1L << ((ulong)uVar6 & 0x3f);
    }
    uVar22 = uVar22 - 1;
    if (uVar22 == 0) break;
    uVar17 = (ulong)((int)uVar17 + (uint)uVar18) % (ulong)uVar4;
    if ((uint)uVar3 <= (uint)uVar17) {
      uVar23 = (uint)uVar4 - (uint)uVar17;
      uVar21 = uVar23 & 0xffff;
      if (uVar18 < (ushort)uVar23) {
        uVar17 = (ulong)((uint)uVar18 * 0x10000 - uVar21) % (ulong)(uint)uVar18;
      }
      else {
        uVar17 = (ulong)(uVar18 - uVar21);
      }
    }
  }
  puVar11 = this->_pivots;
  uVar15 = this->_next_pivot;
  uVar16 = (ulong)uVar15;
  puVar10 = this->_ge_matrix;
  uVar23 = this->_ge_pitch;
  uVar21 = 0;
  uVar17 = 1;
  while( true ) {
    uVar29 = this->_first_heavy_column;
    uVar21 = uVar21 & 0xffff;
    if ((uVar15 <= uVar21) || (uVar29 <= uVar21)) break;
    uVar29 = uVar21 >> 6;
    if ((puVar12[uVar29] & uVar17) != 0) {
      uVar26 = (ulong)(puVar11[uVar21] * uVar23);
      *(uint64_t *)((long)puVar12 + (ulong)(uVar29 * 8)) =
           puVar12[uVar29] ^ uVar17 ^
           -uVar17 & *(ulong *)((long)puVar10 + uVar26 * 8 + (ulong)(uVar29 * 8));
      for (uVar27 = 1; uVar27 < uVar23 - uVar29; uVar27 = uVar27 + 1) {
        puVar1 = (ulong *)((long)puVar12 + uVar27 * 8 + (ulong)(uVar29 << 3));
        *puVar1 = *puVar1 ^ *(ulong *)((long)puVar10 +
                                      uVar27 * 8 + (ulong)(uVar29 << 3) + uVar26 * 8);
      }
    }
    uVar17 = uVar17 >> 0x3f | uVar17 << 1;
    uVar21 = uVar21 + 1;
  }
  if (uVar15 < uVar29) {
    if ((puVar12[uVar15 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
      return Wirehair_NeedMore;
    }
    puVar11[uVar19] = puVar11[uVar16];
    puVar11[uVar16] = (uint16_t)uVar24;
  }
  else {
    uVar18 = this->_dense_count + uVar5;
    uVar23 = (uint)uVar20 + (uint)uVar5 & 0xffff;
    uVar21 = ((int)uVar24 - (uint)uVar18) * this->_heavy_pitch;
    puVar28 = this->_heavy_matrix;
    while( true ) {
      uVar17 = (ulong)this->_first_heavy_column;
      if (uVar23 <= uVar29) break;
      puVar28[(ulong)(uVar29 - this->_first_heavy_column) + (ulong)uVar21] =
           (puVar12[uVar29 >> 6] >> ((ulong)uVar29 & 0x3f) & 1) != 0;
      uVar29 = uVar29 + 1;
    }
    while( true ) {
      uVar15 = this->_next_pivot;
      uVar16 = (ulong)uVar15;
      uVar29 = this->_first_heavy_column;
      if (uVar16 <= uVar17) break;
      uVar29 = (int)uVar17 - uVar29;
      y = puVar28[(ulong)uVar29 + (ulong)uVar21];
      if (y != 0) {
        uVar20 = this->_pivots[uVar17];
        if (uVar20 < uVar18) {
          uVar15 = this->_ge_pitch;
          uVar16 = (ulong)((int)uVar17 + 1);
          uVar27 = 1L << (uVar16 & 0x3f);
          puVar12 = this->_ge_matrix;
          while (uVar29 = (uint)uVar16, uVar29 < uVar23) {
            if ((puVar12[(ulong)(uVar20 * uVar15) + (uVar16 >> 6)] & uVar27) != 0) {
              puVar28[(ulong)(uVar29 - this->_first_heavy_column) + (ulong)uVar21] =
                   puVar28[(ulong)(uVar29 - this->_first_heavy_column) + (ulong)uVar21] ^ y;
            }
            uVar27 = uVar27 >> 0x3f | uVar27 << 1;
            uVar16 = (ulong)(uVar29 + 1);
          }
        }
        else {
          uVar15 = ((uint)uVar20 - (uint)uVar18) * this->_heavy_pitch;
          puVar13 = this->_heavy_matrix;
          uVar2 = puVar13[(ulong)uVar29 + (ulong)uVar15];
          if (uVar2 != '\x01') {
            y = GF256Ctx.GF256_DIV_TABLE[CONCAT11(uVar2,y)];
            puVar28[(ulong)uVar29 + (ulong)uVar21] = y;
          }
          uVar29 = uVar29 + 1;
          gf256_muladd_mem(puVar28 + (ulong)uVar29 + (ulong)uVar21,y,
                           puVar13 + (ulong)uVar29 + (ulong)uVar15,this->_heavy_columns - uVar29);
        }
      }
      uVar17 = uVar17 + 1;
    }
    if (puVar28[(ulong)(uVar15 - uVar29) + (ulong)uVar21] == '\0') {
      return Wirehair_NeedMore;
    }
    uVar23 = this->_first_heavy_pivot;
    puVar11 = this->_pivots;
    if (uVar15 < uVar23) {
      puVar11[uVar19] = puVar11[uVar23];
      puVar11[uVar23] = puVar11[uVar16];
      this->_first_heavy_pivot = uVar23 + 1;
    }
    else {
      puVar11[uVar19] = puVar11[uVar16];
    }
    puVar11[uVar16] = (uint16_t)uVar24;
  }
  this->_next_pivot = uVar15 + 1;
  if (uVar15 + 1 == uVar29) {
    InsertHeavyRows(this);
  }
  bVar14 = Triangle(this);
  return (uint)!bVar14;
}

Assistant:

WirehairResult Codec::ResumeSolveMatrix(
    const unsigned id, ///< Block ID
    const void * GF256_RESTRICT data ///< Block data
)
{
    CAT_IF_DUMP(cout << endl << "---- ResumeSolveMatrix ----" << endl << endl;)

    if (!data) {
        return Wirehair_InvalidInput;
    }

    unsigned row_i, ge_row_i, new_pivot_i;

    // If there is no room for it:
    if (_row_count >= _block_count + _extra_count)
    {
        const uint16_t first_heavy_row = _defer_count + _dense_count;

        new_pivot_i = 0;

        // For each pivot in the list:
        for (unsigned pivot_i = _next_pivot; pivot_i < _pivot_count; ++pivot_i)
        {
            const uint16_t ge_row_k = _pivots[pivot_i];

            // If unused row is extra:
            if (ge_row_k >= first_heavy_row &&
                ge_row_k < (first_heavy_row + _extra_count))
            {
                // Re-use it
                new_pivot_i = (uint16_t)pivot_i;
                break;
            }
        }

        // If nothing was found, return error
        if (!new_pivot_i) {
            return Wirehair_ExtraInsufficient;
        }

        // Look up row indices
        ge_row_i = _pivots[new_pivot_i];
        row_i = _ge_row_map[ge_row_i];
    }
    else
    {
        // Add extra rows to the end of the pivot list
        new_pivot_i = _pivot_count++;
        row_i = _row_count++;
        ge_row_i = _defer_count + _dense_count + row_i - _block_count;
        _ge_row_map[ge_row_i] = (uint16_t)row_i;
        _pivots[new_pivot_i] = (uint16_t)ge_row_i;

        /*
            Before the extra rows are converted to heavy, the new rows
            are added to the end of the pivot list.  And after the extra
            rows are converted to heavy rows, new rows that come in are
            also heavy and should also be at the end of the pivot list.

            So, this doesn't need to change based on what stage of the
            GE solver is running through at this point.
        */
    }

    CAT_IF_DUMP(cout << "Resuming using row slot " << row_i << " and GE row " << ge_row_i << endl;)

    // Update row data needed at this point
    PeelRow * GF256_RESTRICT row = &_peel_rows[row_i];
    row->RecoveryId = id;

    uint8_t * GF256_RESTRICT block_store_dest = _input_blocks + _block_bytes * row_i;

    // Copy new block to input blocks
    if (id != (unsigned)_block_count - 1) {
        memcpy(block_store_dest, data, _block_bytes);
    }
    else
    {
        memcpy(block_store_dest, data, _output_final_bytes);

        memset(
            block_store_dest + _output_final_bytes,
            0,
            _block_bytes - _output_final_bytes);
    }

    // Generate new GE row
    uint64_t * GF256_RESTRICT ge_new_row = _ge_matrix + _ge_pitch * ge_row_i;

    // Clear the row initially before flipping bits on
    memset(ge_new_row, 0, _ge_pitch * sizeof(uint64_t));

    row->Params.Initialize(
        id,
        _p_seed,
        _block_count,
        _mix_count);

    PeelRowIterator iter(row->Params, _block_count, _block_next_prime);
    const RowMixIterator mix(row->Params, _mix_count, _mix_next_prime);

    // Generate mixing bits in GE row
    uint16_t ge_column_i = mix.Columns[0] + _defer_count;
    ge_new_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);
    ge_column_i = mix.Columns[1] + _defer_count;
    ge_new_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);
    ge_column_i = mix.Columns[2] + _defer_count;
    ge_new_row[ge_column_i >> 6] ^= (uint64_t)1 << (ge_column_i & 63);

    // Generate peeled bits in GE row
    do
    {
        const uint16_t column = iter.GetColumn();

        PeelColumn * GF256_RESTRICT ref_col = &_peel_cols[column];

        // If column is peeled:
        if (ref_col->Mark == MARK_PEEL)
        {
            const unsigned row_k = ref_col->PeelRow;
            const uint64_t * GF256_RESTRICT ge_src_row = _compress_matrix + _ge_pitch * row_k;

            // Add compress row to the new GE row
            for (unsigned ii = 0; ii < _ge_pitch; ++ii) {
                ge_new_row[ii] ^= ge_src_row[ii];
            }
        }
        else
        {
            const unsigned ge_column_k = ref_col->GEColumn;

            // Set bit for this deferred column
            ge_new_row[ge_column_k >> 6] ^= (uint64_t)1 << (ge_column_k & 63);
        }
    } while (iter.Iterate());

    uint64_t ge_mask = 1;

    // For each pivot-found column up to the start of the heavy columns:
    for (uint16_t pivot_j = 0; pivot_j < _next_pivot && pivot_j < _first_heavy_column; ++pivot_j)
    {
        const unsigned word_offset = pivot_j >> 6;
        uint64_t * GF256_RESTRICT rem_row = &ge_new_row[word_offset];

        // If bit is set:
        if (0 != (*rem_row & ge_mask))
        {
            const unsigned ge_row_j = _pivots[pivot_j];
            const uint64_t * GF256_RESTRICT ge_pivot_row = _ge_matrix + word_offset + _ge_pitch * ge_row_j;
            const uint64_t row0 = (*ge_pivot_row & ~(ge_mask - 1)) ^ ge_mask;

            // Unroll first word
            *rem_row ^= row0;

            // Add previous pivot row to new row
            CAT_DEBUG_ASSERT(_ge_pitch >= word_offset);
            for (unsigned ii = 1; ii < _ge_pitch - word_offset; ++ii) {
                rem_row[ii] ^= ge_pivot_row[ii];
            }
        }

        ge_mask = CAT_ROL64(ge_mask, 1);
    }

    // If next pivot is not heavy:
    if (_next_pivot < _first_heavy_column)
    {
        const uint64_t bit = ge_new_row[_next_pivot >> 6] & ((uint64_t)1 << (_next_pivot & 63));

        // If the next pivot was not found on this row:
        if (0 == bit) {
            return Wirehair_NeedMore; // Maybe next time...
        }

        // Swap out the pivot index for this one
        _pivots[new_pivot_i] = _pivots[_next_pivot];
        _pivots[_next_pivot] = (uint16_t)ge_row_i;
    }
    else
    {
        const uint16_t column_count = _defer_count + _mix_count;
        const uint16_t first_heavy_row = _dense_count + _defer_count;
        CAT_DEBUG_ASSERT(ge_row_i >= first_heavy_row);
        const unsigned heavy_row_i = ge_row_i - first_heavy_row;
        CAT_DEBUG_ASSERT(heavy_row_i < _heavy_rows);
        uint8_t * GF256_RESTRICT heavy_row = _heavy_matrix + _heavy_pitch * heavy_row_i;

        // For each heavy column:
        for (unsigned ge_column_j = _first_heavy_column; ge_column_j < column_count; ++ge_column_j)
        {
            CAT_DEBUG_ASSERT(ge_column_j >= _first_heavy_column);
            const unsigned heavy_col_j = ge_column_j - _first_heavy_column;
            const uint8_t bit_j = static_cast<uint8_t>((ge_new_row[ge_column_j >> 6] >> (ge_column_j & 63)) & 1);

            // Copy bit into column byte
            heavy_row[heavy_col_j] = bit_j;
        }

        // For each pivot-found column in the heavy columns:
        for (unsigned pivot_j = _first_heavy_column; pivot_j < _next_pivot; ++pivot_j)
        {
            CAT_DEBUG_ASSERT(pivot_j >= _first_heavy_column);
            const unsigned heavy_col_j = pivot_j - _first_heavy_column;
            CAT_DEBUG_ASSERT(heavy_col_j < _heavy_columns);
            const uint8_t code_value = heavy_row[heavy_col_j];

            // If column is zero:
            if (0 == code_value) {
                continue; // Skip it
            }

            const unsigned ge_row_j = _pivots[pivot_j];

            // If previous row is heavy:
            if (ge_row_j >= first_heavy_row)
            {
                // Calculate coefficient of elimination
                CAT_DEBUG_ASSERT(ge_row_j >= first_heavy_row);
                const unsigned heavy_row_j = ge_row_j - first_heavy_row;
                CAT_DEBUG_ASSERT(heavy_row_j < _heavy_rows);
                const uint8_t * GF256_RESTRICT heavy_pivot_row = _heavy_matrix + _heavy_pitch * heavy_row_j;
                CAT_DEBUG_ASSERT(heavy_col_j < _heavy_columns);
                const uint8_t pivot_code = heavy_pivot_row[heavy_col_j];
                const unsigned start_column = heavy_col_j + 1;

                // heavy[m+] += exist[m+] * (code_value / pivot_code)
                if (pivot_code == 1) {
                    // heavy[m+] += exist[m+] * code_value
                    gf256_muladd_mem(
                        heavy_row + start_column,
                        code_value,
                        heavy_pivot_row + start_column,
                        _heavy_columns - start_column);
                }
                else
                {
                    // eliminator = code_value / pivot_code
                    const uint8_t eliminator = gf256_div(code_value, pivot_code);

                    // Store eliminator for later
                    heavy_row[heavy_col_j] = eliminator;

                    // heavy[m+] += exist[m+] * eliminator
                    gf256_muladd_mem(
                        heavy_row + start_column,
                        eliminator,
                        heavy_pivot_row + start_column,
                        _heavy_columns - start_column);
                }
            }
            else
            {
                const uint64_t * GF256_RESTRICT other_row = _ge_matrix + _ge_pitch * ge_row_j;

                unsigned ge_column_k = pivot_j + 1;
                uint64_t ge_mask_k = (uint64_t)1 << (ge_column_k & 63);

                // For each remaining column:
                for (; ge_column_k < column_count; ++ge_column_k)
                {
                    const uint64_t word = other_row[ge_column_k >> 6];
                    const bool nonzero = 0 != (word & ge_mask_k);

                    // If bit is nonzero:
                    if (nonzero) {
                        // Add in the code value for this column
                        heavy_row[ge_column_k - _first_heavy_column] ^= code_value;
                    }

                    ge_mask_k = CAT_ROL64(ge_mask_k, 1);
                }
            } // end if row is heavy
        } // next column

        CAT_DEBUG_ASSERT(_next_pivot >= _first_heavy_column);
        const unsigned next_heavy_col = _next_pivot - _first_heavy_column;

        // If the next pivot was not found on this heavy row:
        if (!heavy_row[next_heavy_col]) {
            return Wirehair_NeedMore; // Maybe next time...
        }

        // If a non-heavy pivot just got moved into heavy pivot list:
        if (_next_pivot < _first_heavy_pivot)
        {
            // Swap out the pivot index for this one
            _pivots[new_pivot_i] = _pivots[_first_heavy_pivot];
            _pivots[_first_heavy_pivot] = _pivots[_next_pivot];

            // And move the first heavy pivot up one to cover the hole
            ++_first_heavy_pivot;
        }
        else {
            // Swap out the pivot index for this one
            _pivots[new_pivot_i] = _pivots[_next_pivot];
        }

        CAT_DEBUG_ASSERT(ge_row_i < _pivot_count);
        _pivots[_next_pivot] = (uint16_t)ge_row_i;
    }

    // NOTE: Pivot was found and is definitely not set anywhere else
    // so it doesn't need to be cleared from any other GE rows.

    // If just starting heavy columns:
    if (++_next_pivot == _first_heavy_column) {
        InsertHeavyRows();
    }

    // Resume Triangle() at next pivot to determine
    return Triangle() ? Wirehair_Success : Wirehair_NeedMore;
}